

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall Qclass_noplot_Test::TestBody(Qclass_noplot_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper AStack_16000;
  Message MStack_15ff8;
  int aiStack_15ff0 [5];
  int iStack_15fdc;
  undefined1 auStack_15fd8 [8];
  AssertionResult gtest_ar;
  Qclass Test;
  Qclass_noplot_Test *this_local;
  
  Qclass::Qclass((Qclass *)&gtest_ar.message_);
  remove("Obstacles1.txt");
  iStack_15fdc = Qclass::plot((Qclass *)&gtest_ar.message_);
  aiStack_15ff0[0] = 0;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)auStack_15fd8,"Test.plot()","0",&iStack_15fdc,aiStack_15ff0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)auStack_15fd8);
  if (!bVar1) {
    testing::Message::Message(&MStack_15ff8);
    message = testing::AssertionResult::failure_message((AssertionResult *)auStack_15fd8);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_16000,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sudrag[P]Q-learning-for-2D-Occupancy-Grid/test/test.cpp"
               ,0x4d,message);
    testing::internal::AssertHelper::operator=(&AStack_16000,&MStack_15ff8);
    testing::internal::AssertHelper::~AssertHelper(&AStack_16000);
    testing::Message::~Message(&MStack_15ff8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)auStack_15fd8);
  Qclass::~Qclass((Qclass *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Qclass, noplot) {
  Qclass Test;
  remove("Obstacles1.txt");
  EXPECT_EQ(Test.plot(), 0);
}